

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O3

Reals __thiscall Omega_h::read_reals_txt(Omega_h *this,istream *stream,LO n,Int ncomps)

{
  int *piVar1;
  Alloc *pAVar2;
  undefined4 in_register_0000000c;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  Reals RVar6;
  HostWrite<double> h_a;
  HostWrite<double> local_88;
  Alloc *local_78;
  ulong local_70;
  ulong local_68;
  Write<double> local_60;
  string local_50;
  
  __n = CONCAT44(in_register_0000000c,ncomps);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  HostWrite<double>::HostWrite(&local_88,ncomps * n,&local_50);
  pvVar3 = extraout_RDX;
  local_78 = (Alloc *)this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    pvVar3 = extraout_RDX_00;
  }
  if (0 < n) {
    local_68 = (ulong)(uint)ncomps;
    __n = (size_t)(uint)n;
    uVar4 = 0;
    local_70 = __n;
    do {
      uVar5 = local_68;
      if (0 < ncomps) {
        do {
          std::istream::_M_extract<double>((double *)stream);
          uVar5 = uVar5 - 1;
          pvVar3 = extraout_RDX_01;
        } while (uVar5 != 0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_70);
  }
  HostWrite<double>::write((HostWrite<double> *)&local_60,(int)&local_88,pvVar3,__n);
  pAVar2 = local_78;
  Read<double>::Read((Read<signed_char> *)local_78,&local_60);
  pvVar3 = extraout_RDX_02;
  if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 && local_60.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_60.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.shared_alloc_.alloc);
      operator_delete(local_60.shared_alloc_.alloc,0x48);
      pvVar3 = extraout_RDX_03;
    }
  }
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(local_88.write_.shared_alloc_.alloc,0x48);
      pvVar3 = extraout_RDX_04;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar6.write_.shared_alloc_.alloc = pAVar2;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals read_reals_txt(std::istream& stream, LO n, Int ncomps) {
  auto h_a = HostWrite<Real>(n * ncomps);
  for (LO i = 0; i < n; ++i) {
    for (Int j = 0; j < ncomps; ++j) {
      stream >> h_a[i * ncomps + j];
    }
  }
  return h_a.write();
}